

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sort.cpp
# Opt level: O2

void silent_dependent_async(size_t W)

{
  code *pcVar1;
  double dVar2;
  pointer piVar3;
  bool bVar4;
  char extraout_AL;
  int iVar5;
  time_t tVar6;
  ulong __new_size;
  vector<int,_std::allocator<int>_> *__range2;
  int *d;
  pointer piVar7;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  vector<int,_std::allocator<int>_> data;
  ulong local_220;
  shared_ptr<tf::WorkerInterface> local_218;
  ResultBuilder DOCTEST_RB;
  undefined1 local_190 [16];
  String local_180;
  Executor executor;
  
  tVar6 = time((time_t *)0x0);
  srand((uint)tVar6);
  local_218.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_218.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_218);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_218.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  __new_size = 0;
  while( true ) {
    if (99999 < __new_size) {
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                (&data.super__Vector_base<int,_std::allocator<int>_>);
      tf::Executor::~Executor(&executor);
      return;
    }
    std::vector<int,_std::allocator<int>_>::resize(&data,__new_size);
    piVar3 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish;
    for (piVar7 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_start; piVar7 != piVar3; piVar7 = piVar7 + 1) {
      iVar5 = rand();
      *piVar7 = iVar5 % 1000 + -500;
    }
    DOCTEST_RB.super_AssertData.m_test_case =
         (TestCaseData *)
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
    ;
    DOCTEST_RB.super_AssertData._8_8_ =
         data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    tf::Executor::
    silent_dependent_async<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_taskflow[P]taskflow_taskflow_algorithm_sort_hpp:595:10),_nullptr>
              ((Executor *)local_190,(anon_class_24_3_b5c2bc7a *)&executor);
    tf::AsyncTask::_decref((AsyncTask *)local_190);
    tf::Executor::wait_for_all(&executor);
    DOCTEST_RB.super_AssertData.m_exception.field_0.buf[0] = '\0';
    DOCTEST_RB.super_AssertData._71_2_ = 0x17;
    DOCTEST_RB.super_AssertData.m_decomp.field_0.buf[0x17] = '\x17';
    DOCTEST_RB.super_AssertData.m_test_case = *(TestCaseData **)(doctest::detail::g_cs + 0x20);
    DOCTEST_RB.super_AssertData.m_at = DT_REQUIRE;
    DOCTEST_RB.super_AssertData.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_sort.cpp"
    ;
    DOCTEST_RB.super_AssertData.m_line = 0x141;
    DOCTEST_RB.super_AssertData.m_expr = "std::is_sorted(data.begin(), data.end())";
    DOCTEST_RB.super_AssertData.m_failed = true;
    DOCTEST_RB.super_AssertData.m_threw = false;
    DOCTEST_RB.super_AssertData.m_threw_as = false;
    DOCTEST_RB.super_AssertData.m_exception_type = "";
    DOCTEST_RB.super_AssertData.m_exception_string = "";
    bVar4 = std::is_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                      ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                       data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish);
    local_220 = (ulong)bVar4 | 0xc00000000;
    doctest::detail::Expression_lhs::operator_cast_to_Result
              ((Result *)(local_190 + 8),(Expression_lhs *)&local_220);
    doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,(Result *)(local_190 + 8));
    doctest::String::~String(&local_180);
    dVar2 = doctest::detail::ResultBuilder::log
                      (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
    if (extraout_AL != '\0') break;
    doctest::detail::ResultBuilder::react(&DOCTEST_RB);
    doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
    bVar4 = __new_size == 0;
    __new_size = __new_size * 10;
    if (bVar4) {
      __new_size = 1;
    }
  }
  pcVar1 = (code *)swi(3);
  (*pcVar1)(SUB84(dVar2,0));
  return;
}

Assistant:

void silent_dependent_async(size_t W) {

  std::srand(static_cast<unsigned int>(time(NULL)));
  
  tf::Executor executor(W);
  std::vector<int> data;

  for(size_t n=0; n < 100000; n = (n ? n*10 : 1)) {
    
    data.resize(n);

    for(auto& d : data) {
      d = ::rand() % 1000 - 500;
    }
  
    executor.silent_dependent_async(tf::make_sort_task(data.begin(), data.end()));
    executor.wait_for_all();
    REQUIRE(std::is_sorted(data.begin(), data.end()));
  }
}